

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompress_insertDictionary(ZSTD_DCtx *dctx,void *dict,size_t dictSize)

{
  U32 UVar1;
  uint uVar2;
  size_t code;
  size_t eSize;
  U32 magic;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_DCtx *dctx_local;
  
  if (dictSize < 8) {
    dctx_local = (ZSTD_DCtx *)ZSTD_refDictContent(dctx,dict,dictSize);
  }
  else {
    UVar1 = MEM_readLE32(dict);
    if (UVar1 == 0xec30a437) {
      UVar1 = MEM_readLE32((void *)((long)dict + 4));
      dctx->dictID = UVar1;
      code = ZSTD_loadDEntropy(&dctx->entropy,dict,dictSize);
      uVar2 = ERR_isError(code);
      if (uVar2 == 0) {
        dctx->fseEntropy = 1;
        dctx->litEntropy = 1;
        dctx_local = (ZSTD_DCtx *)
                     ZSTD_refDictContent(dctx,(void *)((long)dict + code),dictSize - code);
      }
      else {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffe2;
      }
    }
    else {
      dctx_local = (ZSTD_DCtx *)ZSTD_refDictContent(dctx,dict,dictSize);
    }
  }
  return (size_t)dctx_local;
}

Assistant:

static size_t ZSTD_decompress_insertDictionary(ZSTD_DCtx* dctx, const void* dict, size_t dictSize)
{
    if (dictSize < 8) return ZSTD_refDictContent(dctx, dict, dictSize);
    {   U32 const magic = MEM_readLE32(dict);
        if (magic != ZSTD_MAGIC_DICTIONARY) {
            return ZSTD_refDictContent(dctx, dict, dictSize);   /* pure content mode */
    }   }
    dctx->dictID = MEM_readLE32((const char*)dict + ZSTD_FRAMEIDSIZE);

    /* load entropy tables */
    {   size_t const eSize = ZSTD_loadDEntropy(&dctx->entropy, dict, dictSize);
        if (ZSTD_isError(eSize)) return ERROR(dictionary_corrupted);
        dict = (const char*)dict + eSize;
        dictSize -= eSize;
    }
    dctx->litEntropy = dctx->fseEntropy = 1;

    /* reference dictionary content */
    return ZSTD_refDictContent(dctx, dict, dictSize);
}